

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O1

h2o_hostconf_t *
find_hostconf(h2o_hostconf_t **hostconfs,h2o_iovec_t authority,uint16_t default_port)

{
  char cVar1;
  h2o_hostconf_t *phVar2;
  char *pcVar3;
  long lVar4;
  uint16_t uVar5;
  bool bVar6;
  uint16_t uVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  char cVar11;
  long lVar12;
  char *test;
  h2o_hostconf_t **pphVar13;
  undefined8 uStack_70;
  undefined1 local_68 [8];
  h2o_iovec_t hostname;
  h2o_hostconf_t *local_40;
  uint16_t local_32 [4];
  uint16_t port;
  
  if (0xffff < authority.len) {
    return (h2o_hostconf_t *)0x0;
  }
  uStack_70 = 0x1399ea;
  pcVar9 = h2o_url_parse_hostport(authority.base,authority.len,(h2o_iovec_t *)local_68,local_32);
  if (pcVar9 != (char *)0x0) {
    if (local_32[0] == 0xffff) {
      local_32[0] = default_port;
    }
    lVar4 = -((ulong)(hostname.base + 0xf) & 0xfffffffffffffff0);
    pcVar9 = local_68 + lVar4;
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x139a22;
    memcpy(pcVar9,(void *)local_68,(size_t)hostname.base);
    if (hostname.base != (char *)0x0) {
      pcVar10 = (char *)0x0;
      do {
        cVar1 = pcVar9[(long)pcVar10];
        cVar11 = cVar1 + ' ';
        if (0x19 < (int)cVar1 - 0x41U) {
          cVar11 = cVar1;
        }
        pcVar9[(long)pcVar10] = cVar11;
        pcVar10 = pcVar10 + 1;
      } while (hostname.base != pcVar10);
    }
    uVar7 = local_32[0];
    hostname.len = (size_t)(pcVar9 + (long)hostname.base);
    pphVar13 = hostconfs + 1;
    do {
      phVar2 = pphVar13[-1];
      uVar5 = (uint16_t)*(undefined4 *)&(phVar2->authority).port;
      if ((uVar5 != uVar7) && (uVar5 != 0xffff || default_port != uVar7)) goto LAB_00139a8f;
      pcVar10 = (phVar2->authority).host.base;
      pcVar3 = (char *)(phVar2->authority).host.len;
      if (*pcVar10 == '*') {
        if (pcVar3 + -1 < hostname.base) {
          lVar12 = hostname.len - (long)pcVar3;
          *(undefined8 *)((long)&uStack_70 + lVar4) = 0x139acf;
          iVar8 = bcmp(pcVar10 + 1,(void *)(lVar12 + 1),(size_t)(pcVar3 + -1));
          if (iVar8 != 0) goto LAB_00139ad6;
          bVar6 = false;
          local_40 = phVar2;
        }
        else {
LAB_00139ad6:
          bVar6 = true;
        }
        if (bVar6) goto LAB_00139a8f;
        bVar6 = false;
      }
      else {
        if (pcVar3 == hostname.base) {
          if (pcVar3 == (char *)0x0) {
LAB_00139b07:
            bVar6 = false;
            local_40 = phVar2;
            goto LAB_00139a91;
          }
          if (*pcVar10 == *pcVar9) {
            *(undefined8 *)((long)&uStack_70 + lVar4) = 0x139b00;
            iVar8 = bcmp(pcVar10 + 1,local_68 + lVar4 + 1,(size_t)(hostname.base + -1));
            if (iVar8 == 0) goto LAB_00139b07;
          }
        }
LAB_00139a8f:
        bVar6 = true;
      }
LAB_00139a91:
      if (!bVar6) {
        return local_40;
      }
      phVar2 = *pphVar13;
      pphVar13 = pphVar13 + 1;
    } while (phVar2 != (h2o_hostconf_t *)0x0);
  }
  return (h2o_hostconf_t *)0x0;
}

Assistant:

static h2o_hostconf_t *find_hostconf(h2o_hostconf_t **hostconfs, h2o_iovec_t authority, uint16_t default_port)
{
    h2o_iovec_t hostname;
    uint16_t port;
    char *hostname_lc;

    /* safe-guard for alloca */
    if (authority.len >= 65536)
        return NULL;

    /* extract the specified hostname and port */
    if (h2o_url_parse_hostport(authority.base, authority.len, &hostname, &port) == NULL)
        return NULL;
    if (port == 65535)
        port = default_port;

    /* convert supplied hostname to lower-case */
    hostname_lc = alloca(hostname.len);
    memcpy(hostname_lc, hostname.base, hostname.len);
    h2o_strtolower(hostname_lc, hostname.len);

    do {
        h2o_hostconf_t *hostconf = *hostconfs;
        if (hostconf->authority.port == port || (hostconf->authority.port == 65535 && port == default_port)) {
            if (hostconf->authority.host.base[0] == '*') {
                /* matching against "*.foo.bar" */
                size_t cmplen = hostconf->authority.host.len - 1;
                if (cmplen < hostname.len &&
                    memcmp(hostconf->authority.host.base + 1, hostname_lc + hostname.len - cmplen, cmplen) == 0)
                    return hostconf;
            } else {
                /* exact match */
                if (h2o_memis(hostconf->authority.host.base, hostconf->authority.host.len, hostname_lc, hostname.len))
                    return hostconf;
            }
        }
    } while (*++hostconfs != NULL);

    return NULL;
}